

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O0

value_type * __thiscall
booster::
match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator[](match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this,int n)

{
  size_type sVar1;
  const_reference pvVar2;
  int in_EDX;
  undefined8 *in_RSI;
  value_type *in_RDI;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_fffffffffffffff0;
  int iVar3;
  
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::sub_match((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (((-1 < in_EDX) &&
      (iVar3 = in_EDX,
      sVar1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         (in_RSI + 2)), in_EDX < (int)sVar1)) &&
     (pvVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          (in_RSI + 2),(long)iVar3), pvVar2->first != -1)) {
    in_RDI->matched = true;
    (in_RDI->
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ).first._M_current = (char *)*in_RSI;
    (in_RDI->
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ).second._M_current = (char *)*in_RSI;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)(in_RSI + 2),
               (long)iVar3);
    std::advance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,int>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(iVar3,in_stack_fffffffffffffff0),(int)((ulong)in_RSI >> 0x20));
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)(in_RSI + 2),
               (long)iVar3);
    std::advance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,int>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(iVar3,in_stack_fffffffffffffff0),(int)((ulong)in_RSI >> 0x20));
  }
  return in_RDI;
}

Assistant:

value_type operator[](int n) const
		{
			value_type r;
			if(n < 0 || n >= int(offsets_.size()))
				return r;
			if(offsets_[n].first == -1)
				return r;
			r.matched = true;
			r.first = begin_;
			r.second = begin_;
			std::advance(r.first,offsets_[n].first);
			std::advance(r.second,offsets_[n].second);
			return r;
		}